

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Any::Any<std::shared_ptr<henson::ChaiScheduler_const>,void>
          (Any *this,shared_ptr<const_henson::ChaiScheduler> *t_value)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  _Var3._M_head_impl = (Data *)operator_new(0x20);
  (_Var3._M_head_impl)->m_type =
       (type_info *)&std::shared_ptr<henson::ChaiScheduler_const>::typeinfo;
  (_Var3._M_head_impl)->_vptr_Data = (_func_int **)&PTR__Data_Impl_003229c8;
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (t_value->super___shared_ptr<const_henson::ChaiScheduler,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (t_value->super___shared_ptr<const_henson::ChaiScheduler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (t_value->super___shared_ptr<const_henson::ChaiScheduler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (t_value->super___shared_ptr<const_henson::ChaiScheduler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var3._M_head_impl[1]._vptr_Data = (_func_int **)peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var3._M_head_impl + 1) + 8) = p_Var2;
  (this->m_data)._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl = _Var3._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::unique_ptr<Data>(new Data_Impl<typename std::decay<ValueType>::type>(std::forward<ValueType>(t_value))))
        {
        }